

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::anon_unknown_160::CompositePayloadRec
               (uint32_t depth,AssetResolutionResolver *resolver,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *asset_search_paths,Layer *in_layer,PrimSpec *primspec,string *warn,string *err,
               PayloadCompositionOptions *options)

{
  optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
  *this;
  Layer *pLVar1;
  Layer *pLVar2;
  bool bVar3;
  ostream *poVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  Path *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  string *args_01;
  PrimSpec *extraout_RDX;
  PrimSpec *extraout_RDX_00;
  PrimSpec *extraout_RDX_01;
  PrimSpec *extraout_RDX_02;
  PrimSpec *pPVar7;
  string *assetPath;
  PrimSpec *child;
  Layer *pLVar8;
  int iVar9;
  char *pcVar10;
  string *psVar11;
  PrimSpec *err_00;
  Path *this_00;
  PayloadCompositionOptions *in_stack_ffffffffffffe750;
  allocator local_1899;
  PrimSpec *src_ps;
  string *local_1890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1888;
  Path *local_1880;
  Layer *local_1878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1870;
  pointer local_1868;
  optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
  *local_1860;
  string local_1858;
  string asset_path;
  string local_1818;
  string local_17f8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_paths;
  string cwp;
  ostringstream ss_e_1;
  ostringstream ss_e;
  
  if (*(uint *)&(err->_M_dataplus)._M_p < depth) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"CompositePayloadRec");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x30c);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)&ss_e,"Too deep.");
    ::std::operator<<(poVar4,"\n");
    if (warn != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)warn);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  }
  else {
    pLVar8 = (Layer *)(in_layer->_prim_specs)._M_h._M_rehash_policy._M_next_resize;
    pLVar1 = (Layer *)(in_layer->_prim_specs)._M_h._M_single_bucket;
    err_00 = primspec;
    local_1890 = warn;
    local_1878 = in_layer;
    do {
      pLVar2 = local_1878;
      if (pLVar8 == pLVar1) {
        ::std::__cxx11::string::string
                  ((string *)&cwp,
                   (string *)
                   ((long)&(local_1878->_metas).timeCodesPerSecond._metas.comment.contained + 0x18))
        ;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&search_paths,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&(pLVar2->_metas).timeCodesPerSecond._metas.customData.contained);
        psVar11 = local_1890;
        this = (optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
                *)((long)&(pLVar2->_metas).metersPerUnit._metas.customData.contained.data + 8);
        local_1860 = this;
        if (*(char *)((long)&(pLVar2->_metas).metersPerUnit._metas.customData.contained + 8) !=
            '\x01') goto switchD_00170e7b_default;
        pvVar5 = nonstd::optional_lite::
                 optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
                 ::value(this);
        pvVar6 = nonstd::optional_lite::
                 optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
                 ::value(this);
        switch(pvVar5->first) {
        case ResetToExplicit:
        case Prepend:
          local_1868 = (pvVar6->second).
                       super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
          local_1870 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &err->_M_string_length;
          local_1888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &(local_1878->_name)._M_string_length;
          args = &((pvVar6->second).
                   super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
                   .super__Vector_impl_data._M_start)->prim_path;
          goto LAB_00170ead;
        case Append:
          local_1868 = (pvVar6->second).
                       super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
          local_1870 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &err->_M_string_length;
          local_1888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &(local_1878->_name)._M_string_length;
          args = &((pvVar6->second).
                   super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
                   .super__Vector_impl_data._M_start)->prim_path;
          goto LAB_001710c9;
        case Add:
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"CompositePayloadRec");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x35b);
          ::std::operator<<(poVar4," ");
          pcVar10 = "`add` references are not supported yet.";
          break;
        case Delete:
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"CompositePayloadRec");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x359);
          ::std::operator<<(poVar4," ");
          pcVar10 = "`delete` references are not supported yet.";
          break;
        case Order:
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"CompositePayloadRec");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x35d);
          ::std::operator<<(poVar4," ");
          pcVar10 = "`order` references are not supported yet.";
          break;
        case Invalid:
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"CompositePayloadRec");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x35f);
          ::std::operator<<(poVar4," ");
          pcVar10 = "Invalid listedit qualifier to for `references`.";
          break;
        default:
          goto switchD_00170e7b_default;
        }
        poVar4 = ::std::operator<<((ostream *)&ss_e,pcVar10);
        ::std::operator<<(poVar4,"\n");
        if (psVar11 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)psVar11);
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        goto LAB_00171864;
      }
      err_00 = primspec;
      bVar3 = CompositePayloadRec(depth + 1,resolver,asset_search_paths,pLVar8,primspec,local_1890,
                                  err,in_stack_ffffffffffffe750);
      pLVar8 = (Layer *)((long)&(pLVar8->_metas).timeCodesPerSecond._metas.customData.contained +
                        0x18);
    } while (bVar3);
  }
  return false;
LAB_001710c9:
  assetPath = (string *)&args[-1]._variant_part_str.field_2;
  if ((pointer)assetPath == local_1868) goto switchD_00170e7b_default;
  local_1880 = args;
  ::std::__cxx11::string::string((string *)&asset_path,(string *)assetPath);
  Layer::Layer((Layer *)&ss_e);
  this_00 = local_1880;
  src_ps = (PrimSpec *)0x0;
  if (*(long *)((long)&local_1880[-1]._variant_part_str.field_2 + 8) == 0) {
    if (((local_1880->_prim_part)._M_string_length == 0) ||
       (*(local_1880->_prim_part)._M_dataplus._M_p != '/')) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
      poVar4 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"CompositePayloadRec");
      poVar4 = ::std::operator<<(poVar4,"():");
      iVar9 = 0x372;
      goto LAB_001715be;
    }
    bVar3 = Layer::find_primspec_at((Layer *)asset_search_paths,local_1880,&src_ps,psVar11);
    pPVar7 = extraout_RDX_02;
    if (!bVar3) goto LAB_0017184d;
  }
  else {
    args_00 = local_1870;
    err_00 = (PrimSpec *)assetPath;
    bVar3 = LoadAsset(resolver,&cwp,&search_paths,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                       *)local_1870,(AssetPath *)assetPath,local_1880,(Layer *)&ss_e,&src_ps,true,
                      *(bool *)((long)&(err->_M_dataplus)._M_p + 4),
                      *(bool *)((long)&(err->_M_dataplus)._M_p + 5),(string *)primspec,psVar11);
    pPVar7 = extraout_RDX_01;
    if (!bVar3) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
      poVar4 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"CompositePayloadRec");
      poVar4 = ::std::operator<<(poVar4,"():");
      iVar9 = 0x37c;
      goto LAB_0017169e;
    }
  }
  pLVar8 = local_1878;
  if (src_ps != (PrimSpec *)0x0) {
    args_01 = psVar11;
    bVar3 = OverridePrimSpec((tinyusdz *)local_1878,src_ps,pPVar7,psVar11,(string *)err_00);
    if (!bVar3) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
      poVar4 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"CompositePayloadRec");
      poVar4 = ::std::operator<<(poVar4,"():");
      iVar9 = 0x388;
      goto LAB_0017179c;
    }
    if (((((pLVar8->_name).field_2._M_allocated_capacity == 0) ||
         (bVar3 = ::std::operator==(local_1888,"Model"), bVar3)) &&
        ((src_ps->_typeName)._M_string_length != 0)) &&
       (bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&src_ps->_typeName,"Model"), !bVar3)) {
      ::std::__cxx11::string::_M_assign((string *)local_1888);
    }
  }
  Layer::~Layer((Layer *)&ss_e);
  ::std::__cxx11::string::_M_dispose();
  args = (Path *)&local_1880[1]._variant_part.field_2;
  goto LAB_001710c9;
LAB_00170ead:
  assetPath = (string *)&args[-1]._variant_part_str.field_2;
  if ((pointer)assetPath == local_1868) {
switchD_00170e7b_default:
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
    ::reset(local_1860);
    bVar3 = true;
LAB_00171866:
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&search_paths);
    ::std::__cxx11::string::_M_dispose();
    return bVar3;
  }
  local_1880 = args;
  ::std::__cxx11::string::string((string *)&asset_path,(string *)assetPath);
  Layer::Layer((Layer *)&ss_e);
  this_00 = local_1880;
  src_ps = (PrimSpec *)0x0;
  if (*(long *)((long)&local_1880[-1]._variant_part_str.field_2 + 8) == 0) {
    if (((local_1880->_prim_part)._M_string_length == 0) ||
       (*(local_1880->_prim_part)._M_dataplus._M_p != '/')) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
      poVar4 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"CompositePayloadRec");
      poVar4 = ::std::operator<<(poVar4,"():");
      iVar9 = 0x333;
LAB_001715be:
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,iVar9);
      ::std::operator<<(poVar4," ");
      ::std::__cxx11::string::string(local_17f8,"primPath is not absolute path: {}",&local_1899);
      Path::full_path_name_abi_cxx11_(&local_1818,this_00);
      fmt::format<std::__cxx11::string>
                (&local_1858,(fmt *)local_17f8,(string *)&local_1818,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      poVar4 = ::std::operator<<((ostream *)&ss_e_1,(string *)&local_1858);
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::string::_M_dispose();
LAB_001717fe:
      psVar11 = local_1890;
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (psVar11 != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
LAB_00171830:
        ::std::__cxx11::string::append((string *)psVar11);
        ::std::__cxx11::string::_M_dispose();
      }
LAB_00171840:
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
    }
    else {
      bVar3 = Layer::find_primspec_at((Layer *)asset_search_paths,local_1880,&src_ps,psVar11);
      pPVar7 = extraout_RDX_00;
      if (bVar3) goto LAB_00170f7d;
    }
LAB_0017184d:
    Layer::~Layer((Layer *)&ss_e);
    ::std::__cxx11::string::_M_dispose();
LAB_00171864:
    bVar3 = false;
    goto LAB_00171866;
  }
  args_00 = local_1870;
  err_00 = (PrimSpec *)assetPath;
  bVar3 = LoadAsset(resolver,&cwp,&search_paths,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                     *)local_1870,(AssetPath *)assetPath,local_1880,(Layer *)&ss_e,&src_ps,true,
                    *(bool *)((long)&(err->_M_dataplus)._M_p + 4),
                    *(bool *)((long)&(err->_M_dataplus)._M_p + 5),(string *)primspec,psVar11);
  pPVar7 = extraout_RDX;
  if (!bVar3) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
    poVar4 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"CompositePayloadRec");
    poVar4 = ::std::operator<<(poVar4,"():");
    iVar9 = 0x33d;
LAB_0017169e:
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,iVar9);
    ::std::operator<<(poVar4," ");
    ::std::__cxx11::string::string
              (local_17f8,"Failed to `references` asset `{}`",(allocator *)&local_1818);
    fmt::format<std::__cxx11::string>(&local_1858,(fmt *)local_17f8,assetPath,args_00);
    poVar4 = ::std::operator<<((ostream *)&ss_e_1,(string *)&local_1858);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::_M_dispose();
    psVar11 = local_1890;
    ::std::__cxx11::string::_M_dispose();
    if (psVar11 != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      goto LAB_00171830;
    }
    goto LAB_00171840;
  }
LAB_00170f7d:
  pLVar8 = local_1878;
  if (src_ps != (PrimSpec *)0x0) {
    args_01 = psVar11;
    bVar3 = InheritPrimSpec((tinyusdz *)local_1878,src_ps,pPVar7,psVar11,(string *)err_00);
    if (!bVar3) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
      poVar4 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"CompositePayloadRec");
      poVar4 = ::std::operator<<(poVar4,"():");
      iVar9 = 0x349;
LAB_0017179c:
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,iVar9);
      ::std::operator<<(poVar4," ");
      ::std::__cxx11::string::string
                (local_17f8,"Failed to reference layer `{}`",(allocator *)&local_1818);
      fmt::format<std::__cxx11::string>
                (&local_1858,(fmt *)local_17f8,(string *)&asset_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_01);
      poVar4 = ::std::operator<<((ostream *)&ss_e_1,(string *)&local_1858);
      ::std::operator<<(poVar4,"\n");
      goto LAB_001717fe;
    }
    if ((((pLVar8->_name).field_2._M_allocated_capacity == 0) ||
        (bVar3 = ::std::operator==(local_1888,"Model"), bVar3)) &&
       (((src_ps->_typeName)._M_string_length != 0 &&
        (bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&src_ps->_typeName,"Model"), !bVar3)))) {
      ::std::__cxx11::string::_M_assign((string *)local_1888);
    }
  }
  Layer::~Layer((Layer *)&ss_e);
  ::std::__cxx11::string::_M_dispose();
  args = (Path *)&local_1880[1]._variant_part.field_2;
  goto LAB_00170ead;
}

Assistant:

bool CompositePayloadRec(uint32_t depth, AssetResolutionResolver &resolver,
                         const std::vector<std::string> &asset_search_paths,
                         const Layer &in_layer,
                         PrimSpec &primspec /* [inout] */, std::string *warn,
                         std::string *err,
                         const PayloadCompositionOptions &options) {
  if (depth > options.max_depth) {
    PUSH_ERROR_AND_RETURN("Too deep.");
  }

  // Traverse children first.
  for (auto &child : primspec.children()) {
    if (!CompositePayloadRec(depth + 1, resolver, asset_search_paths, in_layer, child,
                             warn, err, options)) {
      return false;
    }
  }

  // Use PrimSpec's AssetResolution state.
  std::string cwp = primspec.get_current_working_path();
  std::vector<std::string> search_paths = primspec.get_asset_search_paths();

  if (primspec.metas().payload) {
    const ListEditQual &qual = primspec.metas().payload.value().first;
    const auto &payloads = primspec.metas().payload.value().second;

    if ((qual == ListEditQual::ResetToExplicit) ||
        (qual == ListEditQual::Prepend)) {
      for (const auto &pl : payloads) {
        std::string asset_path = pl.asset_path.GetAssetPath();
        DCOUT("asset_path = " << asset_path);

        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (pl.asset_path.GetAssetPath().empty()) {
          if (pl.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(pl.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("primPath is not absolute path: {}",
                            pl.prim_path.full_path_name()));
          }
        } else {

          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         pl.asset_path, pl.prim_path, &layer, &src_ps,
                         /* error_when_no_prims_found */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(fmt::format("Failed to `references` asset `{}`",
                                              pl.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `inherits` op
        if (!InheritPrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("Failed to reference layer `{}`", asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }

        DCOUT("inherit done: primspec = " << primspec.name());
      }

    } else if (qual == ListEditQual::Delete) {
      PUSH_ERROR_AND_RETURN("`delete` references are not supported yet.");
    } else if (qual == ListEditQual::Add) {
      PUSH_ERROR_AND_RETURN("`add` references are not supported yet.");
    } else if (qual == ListEditQual::Order) {
      PUSH_ERROR_AND_RETURN("`order` references are not supported yet.");
    } else if (qual == ListEditQual::Invalid) {
      PUSH_ERROR_AND_RETURN("Invalid listedit qualifier to for `references`.");
    } else if (qual == ListEditQual::Append) {
      for (const auto &pl : payloads) {
        std::string asset_path = pl.asset_path.GetAssetPath();

        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (pl.asset_path.GetAssetPath().empty()) {
          if (pl.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(pl.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("primPath is not absolute path: {}",
                            pl.prim_path.full_path_name()));
          }
        } else {

          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         pl.asset_path, pl.prim_path, &layer, &src_ps,
                         /* error_when_no_prims_found */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(fmt::format("Failed to `references` asset `{}`",
                                              pl.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `over` op
        if (!OverridePrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("Failed to reference layer `{}`", asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }
      }
    }

  }

  // Remove `payload`.
  primspec.metas().payload.reset();

  return true;
}